

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen_Capture_Example.cpp
# Opt level: O0

void createwindowgrabber(void)

{
  bool bVar1;
  ostream *this;
  element_type *this_00;
  element_type *peVar2;
  vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> w;
  shared_ptr<SL::Screen_Capture::IScreenCaptureManager> *in_stack_fffffffffffffe58;
  shared_ptr<SL::Screen_Capture::IScreenCaptureManager> *in_stack_fffffffffffffe60;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe68;
  shared_ptr<SL::Screen_Capture::IScreenCaptureManager> *in_stack_fffffffffffffe70;
  duration<long,_std::ratio<1L,_1000L>_> *rel_time;
  allocator<char> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined1 *puVar3;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int local_134;
  duration<long,std::ratio<1l,1000l>> local_130 [12];
  int local_124;
  duration<long,std::ratio<1l,1000l>> local_120 [16];
  duration<long,_std::ratio<1L,_1000L>_> local_110 [5];
  undefined1 local_e8 [72];
  function local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  string *in_stack_ffffffffffffff88;
  undefined1 local_70 [32];
  uint local_50;
  allocator<char> local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90);
  getWindowToCapture(in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::
          empty((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
                in_stack_fffffffffffffe70);
  if (bVar1) {
    this = std::operator<<((ostream *)&std::cout,
                           "In order to test window capturing, you must modify the getWindowToCapture() function to search for a window that actually exists!"
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffffe68,
               (__int_type)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffffe68,
               (__int_type)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    std::shared_ptr<SL::Screen_Capture::IScreenCaptureManager>::shared_ptr
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::shared_ptr<SL::Screen_Capture::IScreenCaptureManager>::operator=
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::shared_ptr<SL::Screen_Capture::IScreenCaptureManager>::~shared_ptr
              ((shared_ptr<SL::Screen_Capture::IScreenCaptureManager> *)0x12250f);
    std::
    function<std::vector<SL::Screen_Capture::Window,std::allocator<SL::Screen_Capture::Window>>()>::
    function<createwindowgrabber()::__0,void>
              ((function<std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_()>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    SL::Screen_Capture::CreateCaptureConfiguration(local_a0);
    this_00 = std::
              __shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x12254a);
    puVar3 = local_e8;
    std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Window_const&)>::
    function<createwindowgrabber()::__1,void>
              ((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    (**(code **)(*(long *)this_00 + 0x10))(local_90,this_00,puVar3);
    peVar2 = std::
             __shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x122593);
    rel_time = local_110;
    std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>::
    function<createwindowgrabber()::__2,void>
              ((function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    (**(code **)(*(long *)peVar2 + 0x20))(local_80,peVar2,rel_time);
    peVar2 = std::
             __shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1225dc);
    (**(code **)(*(long *)peVar2 + 0x28))(local_70);
    in_stack_fffffffffffffe70 = &framgrabber;
    std::shared_ptr<SL::Screen_Capture::IScreenCaptureManager>::operator=
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::shared_ptr<SL::Screen_Capture::IScreenCaptureManager>::~shared_ptr
              ((shared_ptr<SL::Screen_Capture::IScreenCaptureManager> *)0x12261a);
    std::
    shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
    ::~shared_ptr((shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
                   *)0x122627);
    std::function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>
    ::~function((function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>
                 *)0x122634);
    std::
    shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
    ::~shared_ptr((shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
                   *)0x122641);
    std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>::
    ~function((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>
               *)0x12264e);
    std::
    shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
    ::~shared_ptr((shared_ptr<SL::Screen_Capture::ICaptureConfiguration<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Window_&)>_>_>
                   *)0x12265b);
    std::
    function<std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_()>
    ::~function((function<std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>_()>
                 *)0x122668);
    std::
    __shared_ptr_access<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x122672);
    local_124 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_120,&local_124);
    SL::Screen_Capture::IScreenCaptureManager::setFrameChangeInterval<long,std::ratio<1l,1000l>>
              ((IScreenCaptureManager *)this_00,rel_time);
    std::
    __shared_ptr_access<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<SL::Screen_Capture::IScreenCaptureManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1226b9);
    local_134 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_130,&local_134);
    SL::Screen_Capture::IScreenCaptureManager::setMouseChangeInterval<long,std::ratio<1l,1000l>>
              ((IScreenCaptureManager *)this_00,rel_time);
  }
  local_50 = (uint)bVar1;
  std::vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_>::~vector
            ((vector<SL::Screen_Capture::Window,_std::allocator<SL::Screen_Capture::Window>_> *)
             in_stack_fffffffffffffe70);
  return;
}

Assistant:

void createwindowgrabber()
{
    auto w = getWindowToCapture();
    if (w.empty()) {
        std::cout << "In order to test window capturing, you must modify the getWindowToCapture() function to search for a window that actually exists!" << std::endl;
        return;
    }
    realcounter = 0;
    onNewFramecounter = 0;
    framgrabber = nullptr;
    framgrabber =
        SL::Screen_Capture::CreateCaptureConfiguration([]() {
            auto filtereditems = getWindowToCapture(); 
            return filtereditems;
        })

            ->onNewFrame([&](const SL::Screen_Capture::Image &img, const SL::Screen_Capture::Window &window) {
                // Uncomment the below code to write the image to disk for debugging

                /*
                auto r = realcounter.fetch_add(1);
                 auto s = std::to_string(r) + std::string("WINNEW_") + std::string(".jpg");
                 auto size = Width(img) * Height(img) * sizeof(SL::Screen_Capture::ImageBGRA);
                  auto imgbuffer(std::make_unique<unsigned char[]>(size));
                  ExtractAndConvertToRGBA(img, imgbuffer.get(), size);
                  tje_encode_to_file(s.c_str(), Width(img), Height(img), 4, (const unsigned char*)imgbuffer.get());
                  */

                if (std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - onNewFramestart).count() >=
                    1000) {
                    std::cout << "onNewFrame fps" << onNewFramecounter << std::endl;
                    onNewFramecounter = 0;
                    onNewFramestart = std::chrono::high_resolution_clock::now();
                }
                onNewFramecounter += 1;
            })
            ->onMouseChanged([&](const SL::Screen_Capture::Image *img, const SL::Screen_Capture::MousePoint &mousepoint) {
                // Uncomment the below code to write the image to disk for debugging
                /*
                auto r = realcounter.fetch_add(1);
                auto s = std::to_string(r) + std::string(" M") + std::string(".png");
                if (img) {
                    std::cout << "New mouse coordinates  AND NEW Image received."
                              << " x= " << mousepoint.Position.x << " y= " << mousepoint.Position.y << std::endl;
                    lodepng::encode(s, (unsigned char *)StartSrc(*img), Width(*img), Height(*img));
                }
                else {
                    std::cout << "New mouse coordinates received."
                              << " x= " << mousepoint.Position.x << " y= " << mousepoint.Position.y << " The mouse image is still the same as the last
                "
                              << std::endl;
                }
                */
            })
            ->start_capturing();

    framgrabber->setFrameChangeInterval(std::chrono::milliseconds(100));
    framgrabber->setMouseChangeInterval(std::chrono::milliseconds(100));
}